

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePolicyCommand.cxx
# Opt level: O0

bool __thiscall
cmCMakePolicyCommand::HandleSetMode
          (cmCMakePolicyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *pcVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  ostream *poVar5;
  char *pcVar6;
  cmState *this_00;
  allocator local_261;
  string local_260;
  allocator local_239;
  string local_238;
  allocator local_211;
  string local_210;
  string local_1f0;
  ostringstream local_1d0 [8];
  ostringstream e;
  PolicyStatus local_58;
  PolicyStatus status;
  allocator local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCMakePolicyCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar3 == 3) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_20,2);
    bVar2 = std::operator==(pvVar4,"OLD");
    if (bVar2) {
      local_58 = OLD;
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_20,2);
      bVar2 = std::operator==(pvVar4,"NEW");
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_1d0);
        poVar5 = std::operator<<((ostream *)local_1d0,"SET given unrecognized policy status \"");
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_20,2);
        poVar5 = std::operator<<(poVar5,(string *)pvVar4);
        std::operator<<(poVar5,"\"");
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(&this->super_cmCommand,&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        this_local._7_1_ = 0;
        std::__cxx11::ostringstream::~ostringstream(local_1d0);
        goto LAB_0064346c;
      }
      local_58 = NEW;
    }
    pcVar1 = (this->super_cmCommand).Makefile;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_20,1);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmMakefile::SetPolicy(pcVar1,pcVar6,local_58);
    if (bVar2) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_20,1);
      bVar2 = std::operator==(pvVar4,"CMP0001");
      if ((bVar2) && ((local_58 == WARN || (local_58 == OLD)))) {
        this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_238,"CMAKE_BACKWARDS_COMPATIBILITY",&local_239);
        pcVar6 = cmState::GetInitializedCacheValue(this_00,&local_238);
        std::__cxx11::string::~string((string *)&local_238);
        std::allocator<char>::~allocator((allocator<char> *)&local_239);
        if (pcVar6 == (char *)0x0) {
          pcVar1 = (this->super_cmCommand).Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_260,"CMAKE_BACKWARDS_COMPATIBILITY",&local_261);
          cmMakefile::AddCacheDefinition
                    (pcVar1,&local_260,"2.4",
                     "For backwards compatibility, what version of CMake commands and syntax should this version of CMake try to support."
                     ,STRING,false);
          std::__cxx11::string::~string((string *)&local_260);
          std::allocator<char>::~allocator((allocator<char> *)&local_261);
        }
      }
      this_local._7_1_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_210,"SET failed to set policy.",&local_211);
      cmCommand::SetError(&this->super_cmCommand,&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
      this_local._7_1_ = 0;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"SET must be given exactly 2 additional arguments.",&local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    this_local._7_1_ = 0;
  }
LAB_0064346c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCMakePolicyCommand::HandleSetMode(std::vector<std::string> const& args)
{
  if (args.size() != 3) {
    this->SetError("SET must be given exactly 2 additional arguments.");
    return false;
  }

  cmPolicies::PolicyStatus status;
  if (args[2] == "OLD") {
    status = cmPolicies::OLD;
  } else if (args[2] == "NEW") {
    status = cmPolicies::NEW;
  } else {
    std::ostringstream e;
    e << "SET given unrecognized policy status \"" << args[2] << "\"";
    this->SetError(e.str());
    return false;
  }

  if (!this->Makefile->SetPolicy(args[1].c_str(), status)) {
    this->SetError("SET failed to set policy.");
    return false;
  }
  if (args[1] == "CMP0001" &&
      (status == cmPolicies::WARN || status == cmPolicies::OLD)) {
    if (!(this->Makefile->GetState()->GetInitializedCacheValue(
          "CMAKE_BACKWARDS_COMPATIBILITY"))) {
      // Set it to 2.4 because that is the last version where the
      // variable had meaning.
      this->Makefile->AddCacheDefinition(
        "CMAKE_BACKWARDS_COMPATIBILITY", "2.4",
        "For backwards compatibility, what version of CMake "
        "commands and "
        "syntax should this version of CMake try to support.",
        cmStateEnums::STRING);
    }
  }
  return true;
}